

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__init_private__ogg
                    (ma_dr_flac_init_info *pInit,ma_dr_flac_read_proc onRead,
                    ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,void *pUserData,
                    void *pUserDataMD,ma_bool32 relaxed)

{
  ma_result mVar1;
  int iVar2;
  ma_bool32 mVar3;
  long lVar4;
  code *in_RCX;
  code *in_RDX;
  code *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  ma_dr_flac_metadata metadata;
  ma_uint32 blockSize;
  ma_uint8 blockType;
  ma_uint8 isLastBlock;
  ma_dr_flac_streaminfo streaminfo;
  ma_uint8 mappingVersion [2];
  ma_uint8 sig [4];
  ma_uint8 packetType;
  ma_uint32 bytesRemainingInPage;
  int pageBodySize;
  ma_uint32 bytesRead;
  ma_uint32 crc32;
  ma_dr_flac_ogg_page_header header;
  ma_uint32 blockHeader;
  int i;
  ma_uint32 pageBodySize_1;
  undefined4 local_2c8 [2];
  ma_uint32 *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  ma_dr_flac_ogg_page_header *in_stack_fffffffffffffd50;
  ma_dr_flac_streaminfo *in_stack_fffffffffffffd58;
  ma_dr_flac_read_proc in_stack_fffffffffffffd60;
  ma_dr_flac_ogg_page_header *in_stack_fffffffffffffd68;
  void *in_stack_fffffffffffffd70;
  ma_dr_flac_read_proc in_stack_fffffffffffffd78;
  uint local_218;
  byte local_212;
  byte local_211;
  undefined1 local_210 [2];
  undefined2 local_20e;
  undefined4 local_204;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined8 local_1f8;
  char local_1df [2];
  char local_1dd;
  char local_1dc;
  char local_1db;
  char local_1da;
  char local_1d9;
  int local_1d8;
  int local_1d4;
  uint local_1d0;
  undefined4 local_1cc;
  undefined1 local_1c8 [5];
  byte local_1c3;
  undefined4 local_1b8;
  byte local_1ac;
  byte abStack_1ab [259];
  undefined8 local_a8;
  undefined8 local_a0;
  code *local_98;
  code *local_90;
  code *local_88;
  long local_80;
  uint local_74;
  uint *local_70;
  byte *local_68;
  byte *local_60;
  undefined8 local_58;
  code *local_50;
  uint local_44;
  uint *local_40;
  byte *local_38;
  byte *local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  undefined1 *local_10;
  uint local_4;
  
  local_1cc = 0x5fb0a94f;
  local_1d0 = 0;
  *(undefined4 *)(in_RDI + 0x18) = 1;
  *(undefined8 *)(in_RDI + 0x10c8) = 0;
  local_a8 = in_R9;
  local_a0 = in_R8;
  local_98 = in_RCX;
  local_90 = in_RDX;
  local_88 = in_RSI;
  local_80 = in_RDI;
  mVar1 = ma_dr_flac_ogg__read_page_header_after_capture_pattern
                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     (ma_uint32 *)in_stack_fffffffffffffd60,(ma_uint32 *)in_stack_fffffffffffffd58);
  if (mVar1 == MA_SUCCESS) {
    *(ulong *)(local_80 + 0x48) = (ulong)local_1d0 + *(long *)(local_80 + 0x48);
    while ((local_1c3 & 2) != 0) {
      local_10 = local_1c8;
      local_14 = 0;
      for (local_18 = 0; local_18 < (int)(uint)local_1ac; local_18 = local_18 + 1) {
        local_14 = (uint)abStack_1ab[local_18] + local_14;
      }
      local_1d4 = local_14;
      if (local_14 == 0x33) {
        local_1d8 = local_14;
        lVar4 = (*local_88)(local_a0,&local_1d9,1);
        if (lVar4 != 1) {
          return 0;
        }
        local_1d8 = local_1d8 + -1;
        if (local_1d9 == '\x7f') {
          lVar4 = (*local_88)(local_a0,&local_1dd,4);
          if (lVar4 != 4) {
            return 0;
          }
          local_1d8 = local_1d8 + -4;
          if ((((local_1dd == 'F') && (local_1dc == 'L')) && (local_1db == 'A')) &&
             (local_1da == 'C')) {
            lVar4 = (*local_88)(local_a0,local_1df,2);
            if (lVar4 != 2) {
              return 0;
            }
            if (local_1df[0] != '\x01') {
              return 0;
            }
            iVar2 = (*local_90)(local_a0,2,1);
            if (iVar2 == 0) {
              return 0;
            }
            lVar4 = (*local_88)(local_a0,&local_1dd,4);
            if (lVar4 == 4) {
              if (((local_1dd != 'f') || (local_1dc != 'L')) ||
                 ((local_1db != 'a' || (local_1da != 'C')))) {
                return 0;
              }
              local_50 = local_88;
              local_58 = local_a0;
              local_60 = &local_211;
              local_68 = &local_212;
              local_70 = &local_218;
              local_218 = 0;
              lVar4 = (*local_88)(local_a0,&local_74,4);
              if (lVar4 == 4) {
                local_30 = local_60;
                local_38 = local_68;
                local_40 = local_70;
                local_20 = local_74;
                local_4 = local_74;
                local_24 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8
                           | local_74 << 0x18;
                local_1c = local_24;
                *local_60 = (byte)local_74 >> 7;
                *local_38 = (byte)(local_24 >> 0x18) & 0x7f;
                *local_40 = local_24 & 0xffffff;
              }
              local_44 = (uint)(lVar4 == 4);
              if (local_44 != 0) {
                if ((local_212 == 0) && (local_218 == 0x22)) {
                  mVar3 = ma_dr_flac__read_streaminfo
                                    ((ma_dr_flac_read_proc)in_stack_fffffffffffffd68,
                                     in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
                  if (mVar3 == 0) {
                    return 0;
                  }
                  *(undefined4 *)(local_80 + 0x50) = 1;
                  *(undefined4 *)(local_80 + 0x30) = local_204;
                  *(undefined1 *)(local_80 + 0x34) = local_200;
                  *(undefined1 *)(local_80 + 0x35) = local_1ff;
                  *(undefined8 *)(local_80 + 0x38) = local_1f8;
                  *(undefined2 *)(local_80 + 0x40) = local_20e;
                  *(uint *)(local_80 + 0x54) = (uint)((local_211 != 0 ^ 0xffU) & 1);
                  if (local_98 != (code *)0x0) {
                    local_2c8[0] = 0;
                    memcpy(&stack0xfffffffffffffd50,local_210,0x30);
                    (*local_98)(local_a8,local_2c8);
                  }
                  *(long *)(local_80 + 0x48) = (long)local_1d4 + *(long *)(local_80 + 0x48);
                  *(long *)(local_80 + 0x10c8) = *(long *)(local_80 + 0x48) + -0x4f;
                  *(undefined4 *)(local_80 + 0x10c0) = local_1b8;
                  memcpy((void *)(local_80 + 0x10d0),local_1c8,0x120);
                  *(undefined4 *)(local_80 + 0x54) = 1;
                  return 1;
                }
                return 0;
              }
              return 0;
            }
            return 0;
          }
          iVar2 = (*local_90)(local_a0,local_1d8,1);
          if (iVar2 == 0) {
            return 0;
          }
        }
        else {
          iVar2 = (*local_90)(local_a0,local_1d8,1);
          if (iVar2 == 0) {
            return 0;
          }
        }
      }
      else {
        iVar2 = (*local_90)(local_a0,local_14,1);
        if (iVar2 == 0) {
          return 0;
        }
      }
      *(long *)(local_80 + 0x48) = (long)local_1d4 + *(long *)(local_80 + 0x48);
      mVar1 = ma_dr_flac_ogg__read_page_header
                        (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                         in_stack_fffffffffffffd50,
                         (ma_uint32 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                         in_stack_fffffffffffffd40);
      if (mVar1 != MA_SUCCESS) {
        return 0;
      }
      *(ulong *)(local_80 + 0x48) = (ulong)local_1d0 + *(long *)(local_80 + 0x48);
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__init_private__ogg(ma_dr_flac_init_info* pInit, ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, void* pUserData, void* pUserDataMD, ma_bool32 relaxed)
{
    ma_dr_flac_ogg_page_header header;
    ma_uint32 crc32 = MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32;
    ma_uint32 bytesRead = 0;
    (void)relaxed;
    pInit->container = ma_dr_flac_container_ogg;
    pInit->oggFirstBytePos = 0;
    if (ma_dr_flac_ogg__read_page_header_after_capture_pattern(onRead, pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
        return MA_FALSE;
    }
    pInit->runningFilePos += bytesRead;
    for (;;) {
        int pageBodySize;
        if ((header.headerType & 0x02) == 0) {
            return MA_FALSE;
        }
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize == 51) {
            ma_uint32 bytesRemainingInPage = pageBodySize;
            ma_uint8 packetType;
            if (onRead(pUserData, &packetType, 1) != 1) {
                return MA_FALSE;
            }
            bytesRemainingInPage -= 1;
            if (packetType == 0x7F) {
                ma_uint8 sig[4];
                if (onRead(pUserData, sig, 4) != 4) {
                    return MA_FALSE;
                }
                bytesRemainingInPage -= 4;
                if (sig[0] == 'F' && sig[1] == 'L' && sig[2] == 'A' && sig[3] == 'C') {
                    ma_uint8 mappingVersion[2];
                    if (onRead(pUserData, mappingVersion, 2) != 2) {
                        return MA_FALSE;
                    }
                    if (mappingVersion[0] != 1) {
                        return MA_FALSE;
                    }
                    if (!onSeek(pUserData, 2, ma_dr_flac_seek_origin_current)) {
                        return MA_FALSE;
                    }
                    if (onRead(pUserData, sig, 4) != 4) {
                        return MA_FALSE;
                    }
                    if (sig[0] == 'f' && sig[1] == 'L' && sig[2] == 'a' && sig[3] == 'C') {
                        ma_dr_flac_streaminfo streaminfo;
                        ma_uint8 isLastBlock;
                        ma_uint8 blockType;
                        ma_uint32 blockSize;
                        if (!ma_dr_flac__read_and_decode_block_header(onRead, pUserData, &isLastBlock, &blockType, &blockSize)) {
                            return MA_FALSE;
                        }
                        if (blockType != MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO || blockSize != 34) {
                            return MA_FALSE;
                        }
                        if (ma_dr_flac__read_streaminfo(onRead, pUserData, &streaminfo)) {
                            pInit->hasStreamInfoBlock      = MA_TRUE;
                            pInit->sampleRate              = streaminfo.sampleRate;
                            pInit->channels                = streaminfo.channels;
                            pInit->bitsPerSample           = streaminfo.bitsPerSample;
                            pInit->totalPCMFrameCount      = streaminfo.totalPCMFrameCount;
                            pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
                            pInit->hasMetadataBlocks       = !isLastBlock;
                            if (onMeta) {
                                ma_dr_flac_metadata metadata;
                                metadata.type = MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO;
                                metadata.pRawData = NULL;
                                metadata.rawDataSize = 0;
                                metadata.data.streaminfo = streaminfo;
                                onMeta(pUserDataMD, &metadata);
                            }
                            pInit->runningFilePos  += pageBodySize;
                            pInit->oggFirstBytePos  = pInit->runningFilePos - 79;
                            pInit->oggSerial        = header.serialNumber;
                            pInit->oggBosHeader     = header;
                            break;
                        } else {
                            return MA_FALSE;
                        }
                    } else {
                        return MA_FALSE;
                    }
                } else {
                    if (!onSeek(pUserData, bytesRemainingInPage, ma_dr_flac_seek_origin_current)) {
                        return MA_FALSE;
                    }
                }
            } else {
                if (!onSeek(pUserData, bytesRemainingInPage, ma_dr_flac_seek_origin_current)) {
                    return MA_FALSE;
                }
            }
        } else {
            if (!onSeek(pUserData, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
        }
        pInit->runningFilePos += pageBodySize;
        if (ma_dr_flac_ogg__read_page_header(onRead, pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        pInit->runningFilePos += bytesRead;
    }
    pInit->hasMetadataBlocks = MA_TRUE;
    return MA_TRUE;
}